

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLECompressState<unsigned_char,_true>::FlushSegment
          (RLECompressState<unsigned_char,_true> *this)

{
  ulong uVar1;
  BufferHandle *this_00;
  idx_t iVar2;
  idx_t iVar3;
  ulong *puVar4;
  ColumnCheckpointState *pCVar5;
  ulong uVar6;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_60;
  size_t local_58;
  long local_50;
  BufferHandle local_48;
  
  iVar2 = this->entry_count;
  iVar3 = this->max_rle_count;
  local_58 = iVar2 * 2;
  uVar1 = iVar2 + 8;
  uVar6 = iVar2 + 0xf & 0xfffffffffffffff8;
  local_50 = uVar6 + iVar2 * 2;
  this_00 = &this->handle;
  puVar4 = (ulong *)BufferHandle::Ptr(this_00);
  if (uVar1 <= uVar6 && uVar6 - uVar1 != 0) {
    switchD_014c3389::default((data_ptr_t)(uVar1 + (long)puVar4),0,uVar6 - uVar1);
  }
  memmove((data_ptr_t)((long)puVar4 + uVar6),(data_ptr_t)((long)puVar4 + iVar3 + 8),local_58);
  *puVar4 = uVar6;
  BufferHandle::Destroy(this_00);
  pCVar5 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  local_60._M_head_impl =
       (this->current_segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,this_00);
  (*pCVar5->_vptr_ColumnCheckpointState[4])(pCVar5,&local_60,&local_48,local_50);
  BufferHandle::~BufferHandle(&local_48);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &local_60);
  return;
}

Assistant:

void FlushSegment() {
		// flush the segment
		// we compact the segment by moving the counts so they are directly next to the values
		idx_t counts_size = sizeof(rle_count_t) * entry_count;
		idx_t original_rle_offset = RLEConstants::RLE_HEADER_SIZE + max_rle_count * sizeof(T);
		idx_t minimal_rle_offset = RLEConstants::RLE_HEADER_SIZE + sizeof(T) * entry_count;
		idx_t aligned_rle_offset = AlignValue(minimal_rle_offset);
		idx_t total_segment_size = aligned_rle_offset + counts_size;
		auto data_ptr = handle.Ptr();
		if (aligned_rle_offset > minimal_rle_offset) {
			memset(data_ptr + minimal_rle_offset, 0, aligned_rle_offset - minimal_rle_offset);
		}
		memmove(data_ptr + aligned_rle_offset, data_ptr + original_rle_offset, counts_size);
		// store the final RLE offset within the segment
		Store<uint64_t>(aligned_rle_offset, data_ptr);
		handle.Destroy();

		auto &state = checkpoint_data.GetCheckpointState();
		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}